

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O0

void __thiscall xmrig::DaemonClient::onHttpData(DaemonClient *this,HttpData *data)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  ParseErrorCode parseErrorCode;
  String *this_00;
  char *pcVar4;
  char *pcVar5;
  Value *obj;
  Value *key;
  int *in_RSI;
  DaemonClient *in_RDI;
  Document doc;
  char *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  char *in_stack_fffffffffffffeb8;
  DaemonClient *in_stack_fffffffffffffec0;
  CrtAllocator *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffed8;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  DaemonClient *in_stack_ffffffffffffff90;
  HttpContext *in_stack_ffffffffffffff98;
  string local_30 [32];
  int *local_10;
  
  if (in_RSI[1] == 200) {
    local_10 = in_RSI;
    HttpContext::ip_abi_cxx11_(in_stack_ffffffffffffff98);
    std::__cxx11::string::c_str();
    String::operator=((String *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                      in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(local_30);
    uVar3 = (*(in_RDI->super_BaseClient).super_IClient._vptr_IClient[5])();
    if ((uVar3 & 1) != 0) {
      HttpsClient::version
                ((HttpsClient *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      String::operator=((String *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                        in_stack_fffffffffffffea8);
      HttpsClient::fingerprint((HttpsClient *)(local_10 + -2));
      String::operator=((String *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                        in_stack_fffffffffffffea8);
    }
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                      CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                      in_stack_fffffffffffffec8);
    std::__cxx11::string::c_str();
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::Parse((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
            in_stack_fffffffffffffea8);
    bVar1 = rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::HasParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                             *)0x1eabe3);
    if (bVar1) {
      bVar1 = BaseClient::isQuiet(&in_RDI->super_BaseClient);
      if (!bVar1) {
        this_00 = Pool::host((Pool *)0x1eac37);
        pcVar4 = String::data(this_00);
        uVar2 = Pool::port((Pool *)0x1eac69);
        parseErrorCode =
             rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                              *)0x1eac89);
        pcVar5 = rapidjson::GetParseError_En(parseErrorCode);
        Log::print(ERR,"[%s:%d] JSON decode failed: \"%s\"",pcVar4,(ulong)uVar2,pcVar5);
      }
      retry((DaemonClient *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    }
    else if (*local_10 == 1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                              in_stack_fffffffffffffea8);
      if (bVar1) {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        if (bVar1) {
          Json::getUint64((Value *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                          (uint64_t)in_stack_fffffffffffffeb8);
          Json::getString((Value *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                          in_stack_fffffffffffffeb8);
          bVar1 = isOutdated(in_stack_fffffffffffffec0,(uint64_t)in_stack_fffffffffffffeb8,
                             (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
          if (bVar1) {
            getBlockTemplate(in_stack_ffffffffffffff90);
          }
        }
        else {
          in_RDI->m_monero = false;
          send(in_RDI,1,kGetInfo,0,0);
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                                in_stack_fffffffffffffea8);
        if (bVar1) {
          Json::getUint64((Value *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                          (uint64_t)in_stack_fffffffffffffeb8);
          Json::getString((Value *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                          in_stack_fffffffffffffeb8);
          bVar1 = isOutdated(in_stack_fffffffffffffec0,(uint64_t)in_stack_fffffffffffffeb8,
                             (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
          if (bVar1) {
            getBlockTemplate(in_stack_ffffffffffffff90);
          }
        }
      }
    }
    else {
      obj = (Value *)Json::getInt64((Value *)in_stack_fffffffffffffec8,
                                    (char *)in_stack_fffffffffffffec0,
                                    (int64_t)in_stack_fffffffffffffeb8);
      key = Json::getObject(obj,(char *)in_stack_fffffffffffffec0);
      Json::getObject(obj,(char *)key);
      in_stack_fffffffffffffeb7 =
           parseResponse((DaemonClient *)
                         CONCAT17(in_stack_fffffffffffffeef,
                                  CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
                         (int64_t)in_stack_fffffffffffffee0,(Value *)in_stack_fffffffffffffed8,
                         (Value *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      if (!(bool)in_stack_fffffffffffffeb7) {
        retry((DaemonClient *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      }
    }
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  }
  else {
    retry((DaemonClient *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  }
  return;
}

Assistant:

void xmrig::DaemonClient::onHttpData(const HttpData &data)
{
    if (data.status != HTTP_STATUS_OK) {
        return retry();
    }

    LOG_DEBUG("[%s:%d] received (%d bytes): \"%.*s\"", m_pool.host().data(), m_pool.port(), static_cast<int>(data.body.size()), static_cast<int>(data.body.size()), data.body.c_str());

    m_ip = static_cast<const HttpContext &>(data).ip().c_str();

#   ifdef XMRIG_FEATURE_TLS
    if (isTLS()) {
        m_tlsVersion     = static_cast<const HttpsClient &>(data).version();
        m_tlsFingerprint = static_cast<const HttpsClient &>(data).fingerprint();
    }
#   endif

    rapidjson::Document doc;
    if (doc.Parse(data.body.c_str()).HasParseError()) {
        if (!isQuiet()) {
            LOG_ERR("[%s:%d] JSON decode failed: \"%s\"", m_pool.host().data(), m_pool.port(), rapidjson::GetParseError_En(doc.GetParseError()));
        }

        return retry();
    }

    if (data.method == HTTP_GET) {
        if (data.url == kGetHeight) {
            if (!doc.HasMember(kHash)) {
                m_monero = false;

                return send(HTTP_GET, kGetInfo);
            }

            if (isOutdated(Json::getUint64(doc, kHeight), Json::getString(doc, kHash))) {
                getBlockTemplate();
            }
        }
        else if (data.url == kGetInfo && isOutdated(Json::getUint64(doc, kHeight), Json::getString(doc, "top_block_hash"))) {
            getBlockTemplate();
        }

        return;
    }

    if (!parseResponse(Json::getInt64(doc, "id", -1), Json::getObject(doc, "result"), Json::getObject(doc, "error"))) {
        retry();
    }
}